

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloomFilterTest.cpp
# Opt level: O3

BloomFilter<supermap::Key<10UL>_> *
getFilterWithErrorProbability<10ul>
          (BloomFilter<supermap::Key<10UL>_> *__return_storage_ptr__,double errorProbability)

{
  pointer *__ptr;
  __uniq_ptr_impl<supermap::Hasher,_std::default_delete<supermap::Hasher>_> local_18;
  double local_10;
  
  local_10 = errorProbability;
  local_18._M_t.super__Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>.
  super__Head_base<0UL,_supermap::Hasher_*,_false>._M_head_impl =
       (tuple<supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>)operator_new(8);
  *(undefined ***)
   local_18._M_t.super__Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>.
   super__Head_base<0UL,_supermap::Hasher_*,_false>._M_head_impl = &PTR_clone_00200e30;
  supermap::BloomFilter<supermap::Key<10UL>_>::BloomFilter
            (__return_storage_ptr__,local_10,
             (unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *)&local_18);
  if ((_Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>)
      local_18._M_t.
      super__Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>.
      super__Head_base<0UL,_supermap::Hasher_*,_false>._M_head_impl != (Hasher *)0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>
                          .super__Head_base<0UL,_supermap::Hasher_*,_false>._M_head_impl + 0x10))();
  }
  return __return_storage_ptr__;
}

Assistant:

supermap::BloomFilter<supermap::Key<Len>> getFilterWithErrorProbability(double errorProbability) {
    std::unique_ptr<supermap::Hasher> hasher = std::make_unique<supermap::XXHasher>();
    return supermap::BloomFilter<supermap::Key<Len>>(errorProbability, std::move(hasher));
}